

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

us_listen_socket_t *
us_socket_context_listen
          (int ssl,us_socket_context_t *context,char *host,int port,int options,int socket_ext_size)

{
  addrinfo **ppaVar1;
  us_socket_t *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  us_listen_socket_t *puVar7;
  addrinfo *__req;
  addrinfo *paVar8;
  bool bVar9;
  addrinfo *result;
  int enabled;
  char port_string [16];
  addrinfo *local_90;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  char local_78 [24];
  addrinfo local_60;
  
  if (ssl != 0) {
    puVar7 = us_internal_ssl_socket_context_listen
                       ((us_internal_ssl_socket_context_t *)context,host,port,options,
                        socket_ext_size);
    return puVar7;
  }
  __req = &local_60;
  local_60.ai_addrlen = 0;
  local_60._20_4_ = 0;
  local_60.ai_addr = (sockaddr *)0x0;
  local_60.ai_canonname = (char *)0x0;
  local_60.ai_next = (addrinfo *)0x0;
  local_60.ai_flags = 1;
  local_60.ai_family = 0;
  local_60.ai_socktype = 1;
  local_60.ai_protocol = 0;
  snprintf(local_78,0x10,"%d");
  iVar3 = getaddrinfo(host,local_78,__req,&local_90);
  if (iVar3 == 0) {
    paVar8 = local_90;
    uVar4 = socket_ext_size;
    if (local_90 == (addrinfo *)0x0) {
      local_90 = (addrinfo *)0x0;
    }
    else {
      do {
        local_84 = uVar4;
        iVar3 = -1;
        if (paVar8->ai_family == 10) {
          iVar3 = socket(10,paVar8->ai_socktype | 0x80800,paVar8->ai_protocol);
          uVar4 = fcntl(iVar3,3,0);
          fcntl(iVar3,4,(ulong)(uVar4 | 0x800));
          __req = paVar8;
        }
        uVar4 = local_84;
        bVar9 = iVar3 == -1;
      } while ((bVar9) &&
              (ppaVar1 = &paVar8->ai_next, paVar8 = *ppaVar1, *ppaVar1 != (addrinfo *)0x0));
      paVar8 = local_90;
      if (local_90 != (addrinfo *)0x0 && iVar3 == -1) {
        do {
          iVar3 = -1;
          if (paVar8->ai_family == 2) {
            iVar3 = socket(2,paVar8->ai_socktype | 0x80800,paVar8->ai_protocol);
            uVar5 = fcntl(iVar3,3,0);
            fcntl(iVar3,4,(ulong)(uVar5 | 0x800));
            __req = paVar8;
          }
          bVar9 = iVar3 == -1;
        } while ((bVar9) &&
                (ppaVar1 = &paVar8->ai_next, paVar8 = *ppaVar1, *ppaVar1 != (addrinfo *)0x0));
      }
      if (!bVar9) {
        if ((options & 1U) == 0) {
          local_80 = 1;
          setsockopt(iVar3,1,0xf,&local_80,4);
        }
        local_80 = 1;
        setsockopt(iVar3,1,2,&local_80,4);
        local_7c = 0;
        setsockopt(iVar3,0x29,0x1a,&local_7c,4);
        iVar6 = bind(iVar3,__req->ai_addr,__req->ai_addrlen);
        if ((iVar6 == 0) && (iVar6 = listen(iVar3,0x200), iVar6 == 0)) {
          freeaddrinfo(local_90);
          if (iVar3 == -1) {
            return (us_listen_socket_t *)0x0;
          }
          puVar7 = (us_listen_socket_t *)us_create_poll(context->loop,0,0x40);
          us_poll_init((us_poll_t *)puVar7,iVar3,2);
          us_poll_start((us_poll_t *)puVar7,context->loop,1);
          (puVar7->s).context = context;
          (puVar7->s).timeout = 0;
          puVar2 = context->head;
          (puVar7->s).next = puVar2;
          (puVar7->s).prev = (us_socket_t *)0x0;
          if (puVar2 != (us_socket_t *)0x0) {
            puVar2->prev = (us_socket_t *)puVar7;
          }
          context->head = (us_socket_t *)puVar7;
          puVar7->socket_ext_size = uVar4;
          return puVar7;
        }
        close(iVar3);
      }
    }
    freeaddrinfo(local_90);
  }
  return (us_listen_socket_t *)0x0;
}

Assistant:

struct us_listen_socket_t *us_socket_context_listen(int ssl, struct us_socket_context_t *context, const char *host, int port, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_context_listen((struct us_internal_ssl_socket_context_t *) context, host, port, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR listen_socket_fd = bsd_create_listen_socket(host, port, options);

    if (listen_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_listen_socket_t));
    us_poll_init(p, listen_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_READABLE);

    struct us_listen_socket_t *ls = (struct us_listen_socket_t *) p;

    ls->s.context = context;
    ls->s.timeout = 0;
    ls->s.next = 0;
    us_internal_socket_context_link(context, &ls->s);

    ls->socket_ext_size = socket_ext_size;

    return ls;
}